

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void pulse_prog_horde_jackal(OBJ_DATA *obj,bool isTick)

{
  CHAR_DATA *ch_00;
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  AFFECT_DATA af;
  CHAR_DATA *ch;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  CHAR_DATA *in_stack_ffffffffffffff80;
  
  ch_00 = *(CHAR_DATA **)(in_RDI + 0x28);
  if (ch_00 != (CHAR_DATA *)0x0) {
    pCVar1 = ch_00->fighting;
    bVar2 = is_affected(ch_00,(int)gsn_jackal);
    if (bVar2) {
      affect_strip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    if ((ch_00->fighting != (CHAR_DATA *)0x0) && (bVar2 = is_affected(ch_00,(int)gsn_rage), bVar2))
    {
      init_affect((AFFECT_DATA *)0x6667db);
      iVar3 = (int)(short)(int)((100.0 - ((float)pCVar1->hit / (float)(int)pCVar1->max_hit) * 100.0)
                               * 0.5);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

void pulse_prog_horde_jackal(OBJ_DATA *obj, bool isTick)
{
	CHAR_DATA *victim, *ch = obj->carried_by;
	AFFECT_DATA af;

	if (!ch)
		return;

	victim = ch->fighting;

	if (is_affected(ch, gsn_jackal))
		affect_strip(ch, gsn_jackal);

	if (!ch->fighting || !is_affected(ch, gsn_rage))
		return;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_jackal;
	af.aftype = AFT_INVIS;
	af.level = ch->level;
	af.duration = 2;
	af.location = APPLY_DAMROLL;
	af.modifier = (short)((100 - (((float)victim->hit / (float)victim->max_hit) * 100)) / 2) * (ch->level / 51);
	affect_to_char(ch, &af);

	af.location = APPLY_HITROLL;
	affect_to_char(ch, &af);
}